

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall
fasttext::Dictionary::addNgrams(Dictionary *this,vector<int,_std::allocator<int>_> *line,int32_t n)

{
  ulong uVar1;
  iterator __position;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000014;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int local_5c;
  ulong local_58;
  undefined8 local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_50 = CONCAT44(in_register_00000014,n);
  local_58 = (ulong)((long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
  if (0 < (int)(uint)local_58) {
    local_40 = (ulong)((uint)local_58 & 0x7fffffff);
    local_48 = 1;
    local_38 = 0;
    uVar5 = (ulong)(uint)n;
    do {
      iVar3 = (int)local_58;
      uVar6 = local_58 & 0xffffffff;
      if ((int)uVar5 < iVar3) {
        uVar6 = uVar5;
      }
      uVar1 = local_38 + 1;
      iVar2 = (int)local_50 + (int)local_38;
      if (iVar3 < iVar2) {
        iVar2 = iVar3;
      }
      if ((long)uVar1 < (long)iVar2) {
        uVar7 = (ulong)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[local_38];
        uVar4 = local_48;
        local_38 = uVar1;
        do {
          uVar7 = (long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar4] + uVar7 * 0x6eac5db;
          local_5c = (int)(uVar7 % (ulong)(long)((this->args_).
                                                 super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr)->bucket) + this->nwords_;
          __position._M_current =
               (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_finish;
          if (__position._M_current ==
              (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (line,__position,&local_5c);
          }
          else {
            *__position._M_current = local_5c;
            (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = __position._M_current + 1;
          }
          uVar4 = uVar4 + 1;
          uVar1 = local_38;
        } while (uVar6 != uVar4);
      }
      local_38 = uVar1;
      local_48 = local_48 + 1;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (local_38 != local_40);
  }
  return;
}

Assistant:

void Dictionary::addNgrams(std::vector<int32_t>& line, int32_t n) const {
  int32_t line_size = line.size();
  for (int32_t i = 0; i < line_size; i++) {
    uint64_t h = line[i];
    for (int32_t j = i + 1; j < line_size && j < i + n; j++) {
      h = h * 116049371 + line[j];
      line.push_back(nwords_ + (h % args_->bucket));
    }
  }
}